

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShParser.cpp
# Opt level: O0

bool __thiscall ShParser::matchSymbol(ShParser *this,Parser *parser,char symbol)

{
  char symbol_local;
  Parser *parser_local;
  ShParser *this_local;
  
  switch(symbol) {
  case '#':
    this_local._7_1_ = Parser::matchToken(parser,Hash,false);
    break;
  default:
    this_local._7_1_ = false;
    break;
  case '(':
    this_local._7_1_ = Parser::matchToken(parser,LParen,false);
    break;
  case ')':
    this_local._7_1_ = Parser::matchToken(parser,RParen,false);
    break;
  case '+':
    this_local._7_1_ = Parser::matchToken(parser,Plus,false);
    break;
  case ',':
    this_local._7_1_ = Parser::matchToken(parser,Comma,false);
    break;
  case '-':
    this_local._7_1_ = Parser::matchToken(parser,Minus,false);
  }
  return this_local._7_1_;
}

Assistant:

bool ShParser::matchSymbol(Parser& parser, char symbol)
{
	switch (symbol)
	{
	case '(':
		return parser.matchToken(TokenType::LParen);
	case ')':
		return parser.matchToken(TokenType::RParen);
	case ',':
		return parser.matchToken(TokenType::Comma);
	case '#':
		return parser.matchToken(TokenType::Hash);
	case '-':
		return parser.matchToken(TokenType::Minus);
	case '+':
		return parser.matchToken(TokenType::Plus);
	}

	return false;
}